

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::clickFunc
          (TutorialApplication *this,GLFWwindow *window,int button,int action,int mods)

{
  double dVar1;
  bool bVar2;
  ImGuiIO *pIVar3;
  int in_ECX;
  float in_EDX;
  float in_ESI;
  double *in_RDI;
  int in_R8D;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  Vec3fa up;
  Vec3fa right;
  Vec3fa delta;
  bool hit;
  Vec3fa p;
  ISPCCamera ispccamera;
  double y;
  double x;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  vfloat4 c_2;
  vfloat4 b;
  vfloat4 a_2;
  vfloat4 c_3;
  vfloat4 b_1;
  vfloat4 a_3;
  int in_stack_fffffffffffff228;
  int in_stack_fffffffffffff22c;
  GLFWwindow *in_stack_fffffffffffff230;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d78;
  undefined8 uStack_d70;
  double local_d48;
  double dStack_d40;
  float local_d2c;
  float local_d28;
  float local_d24;
  float local_d20;
  float local_d1c;
  float local_d18;
  double local_cf8;
  Vec3fa *in_stack_fffffffffffff310;
  undefined4 in_stack_fffffffffffff318;
  size_t in_stack_fffffffffffff388;
  size_t in_stack_fffffffffffff390;
  Camera *in_stack_fffffffffffff398;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_6c8;
  float local_628;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_ec;
  float local_e8;
  float local_a4;
  float local_a0;
  
  ImGui_ImplGlfw_MouseButtonCallback
            (in_stack_fffffffffffff230,in_stack_fffffffffffff22c,in_stack_fffffffffffff228,
             (int)((ulong)in_RDI >> 0x20));
  pIVar3 = ImGui::GetIO();
  if ((pIVar3->WantCaptureMouse & 1U) == 0) {
    glfwGetCursorPos(in_stack_fffffffffffff230,
                     (double *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),in_RDI)
    ;
    if (in_ECX == 0) {
      *(undefined4 *)(in_RDI + 0x33) = 0;
    }
    else if (in_ECX == 1) {
      if (in_EDX == 1.4013e-45) {
        Camera::getISPCCamera
                  (in_stack_fffffffffffff398,in_stack_fffffffffffff390,in_stack_fffffffffffff388);
        bVar2 = device_pick(in_ESI,in_EDX,(ISPCCamera *)CONCAT44(in_R8D,in_stack_fffffffffffff318),
                            in_stack_fffffffffffff310);
        if (bVar2) {
          dVar1 = in_RDI[0x1e];
          local_5d8 = SUB84(local_d48,0);
          fStack_5d4 = (float)((ulong)local_d48 >> 0x20);
          fStack_5d0 = SUB84(dStack_d40,0);
          local_5e8 = SUB84(dVar1,0);
          fStack_5e4 = (float)((ulong)dVar1 >> 0x20);
          fStack_5e0 = SUB84(in_RDI[0x1f],0);
          fVar4 = local_d2c * local_d2c + local_d28 * local_d28 + local_d24 * local_d24;
          auVar6 = rsqrtss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
          local_628 = auVar6._0_4_;
          fVar5 = local_d20 * local_d20 + local_d1c * local_d1c + local_d18 * local_d18;
          auVar6 = rsqrtss(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
          local_6c8 = auVar6._0_4_;
          in_RDI[0x1e] = local_d48;
          in_RDI[0x1f] = dStack_d40;
          fVar4 = (local_5d8 - local_5e8) *
                  local_d2c * (local_628 * 1.5 + fVar4 * -0.5 * local_628 * local_628 * local_628) +
                  (fStack_5d4 - fStack_5e4) * local_e8 + (fStack_5d0 - fStack_5e0) * local_ec;
          local_9e8 = (float)local_d78;
          fStack_9e4 = (float)((ulong)local_d78 >> 0x20);
          fStack_9e0 = (float)uStack_d70;
          fStack_9dc = (float)((ulong)uStack_d70 >> 0x20);
          fVar5 = (local_5d8 - local_5e8) *
                  local_d20 * (local_6c8 * 1.5 + fVar5 * -0.5 * local_6c8 * local_6c8 * local_6c8) +
                  (fStack_5d4 - fStack_5e4) * local_a0 + (fStack_5d0 - fStack_5e0) * local_a4;
          local_a08 = (float)local_d98;
          fStack_a04 = (float)((ulong)local_d98 >> 0x20);
          fStack_a00 = (float)uStack_d90;
          fStack_9fc = (float)((ulong)uStack_d90 >> 0x20);
          dVar1 = in_RDI[0x1c];
          local_598 = SUB84(dVar1,0);
          fStack_594 = (float)((ulong)dVar1 >> 0x20);
          fStack_590 = SUB84(in_RDI[0x1d],0);
          fStack_58c = (float)((ulong)in_RDI[0x1d] >> 0x20);
          in_RDI[0x1c] = (double)CONCAT44(fStack_594 + fVar4 * fStack_9e4 + fVar5 * fStack_a04,
                                          local_598 + fVar4 * local_9e8 + fVar5 * local_a08);
          in_RDI[0x1d] = (double)CONCAT44(fStack_58c + fVar4 * fStack_9dc + fVar5 * fStack_9fc,
                                          fStack_590 + fVar4 * fStack_9e0 + fVar5 * fStack_a00);
        }
      }
      else if (in_EDX == 2.8026e-45) {
        printf("pixel pos (%d, %d)\n",(ulong)(uint)(int)(double)in_stack_fffffffffffff310,
               (ulong)(uint)(int)local_cf8);
      }
      else {
        in_RDI[0x34] = (double)in_stack_fffffffffffff310;
        in_RDI[0x35] = local_cf8;
        if ((in_EDX == 0.0) && (in_R8D == 1)) {
          *(undefined4 *)(in_RDI + 0x33) = 1;
        }
        else if ((in_EDX == 0.0) && (in_R8D == 2)) {
          *(undefined4 *)(in_RDI + 0x33) = 3;
        }
        else if (in_EDX == 0.0) {
          *(undefined4 *)(in_RDI + 0x33) = 4;
        }
      }
    }
  }
  return;
}

Assistant:

void TutorialApplication::clickFunc(GLFWwindow* window, int button, int action, int mods)
  {
    ImGui_ImplGlfw_MouseButtonCallback(window,button,action,mods);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    double x,y;
    glfwGetCursorPos(window,&x,&y);
    
    if (action == GLFW_RELEASE)
    {
      mouseMode = 0;
    }
    else if (action == GLFW_PRESS)
    {
      if (button == GLFW_MOUSE_BUTTON_RIGHT)
      {
        ISPCCamera ispccamera = camera.getISPCCamera(width,height);
        Vec3fa p; bool hit = device_pick(float(x),float(y),ispccamera,p);

        if (hit) {
          Vec3fa delta = p - camera.to;
          Vec3fa right = normalize(ispccamera.xfm.l.vx);
          Vec3fa up    = normalize(ispccamera.xfm.l.vy);
          camera.to = p;
          camera.from += dot(delta,right)*right + dot(delta,up)*up;
        }
      }
      else if (button == GLFW_MOUSE_BUTTON_MIDDLE) {
        printf("pixel pos (%d, %d)\n", (int)x, (int)y);
      }
      else
      {
        clickX = x; clickY = y;
        if      (button == GLFW_MOUSE_BUTTON_LEFT && mods == GLFW_MOD_SHIFT) mouseMode = 1;
        else if (button == GLFW_MOUSE_BUTTON_LEFT && mods == GLFW_MOD_CONTROL ) mouseMode = 3;
        else if (button == GLFW_MOUSE_BUTTON_LEFT) mouseMode = 4;
      }
    }
  }